

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

char * tinyfd_selectFolderDialog(char *aTitle,char *aDefaultPath)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  FILE *__stream;
  char *pcVar6;
  size_t __n;
  undefined4 uVar7;
  char lDialogString [1024];
  char local_428 [4];
  undefined1 auStack_424 [2];
  undefined1 uStack_422;
  undefined8 uStack_421;
  undefined8 uStack_419;
  char acStack_410 [5];
  char acStack_40b [8];
  char acStack_403 [13];
  char acStack_3f6 [974];
  
  tinyfd_selectFolderDialog::lBuff[0] = '\0';
  iVar2 = osascriptPresent();
  if (iVar2 != 0) {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(local_428,"osas",4);
    auStack_424 = (undefined1  [2])0x7263;
    uStack_422 = 0x69;
    uStack_421._0_1_ = 0x70;
    uStack_421._1_1_ = 0x74;
    uStack_421._2_1_ = 0x20;
    uStack_421._3_4_ = uStack_421._3_4_ & 0xffffff00;
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(local_428);
      builtin_strncpy(acStack_403 + sVar4 + 3,"e \'Activate\'",0xd);
      builtin_strncpy(local_428 + sVar4," -e \'tel",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"l applic",8);
      builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"ation \"S",8);
      builtin_strncpy(acStack_410 + sVar4,"ystem Ev",8);
      builtin_strncpy(acStack_40b + sVar4 + 3,"ents\"\' -",8);
    }
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4," -e \'try",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"\' -e \'PO",8);
    builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"SIX path",8);
    builtin_strncpy(acStack_410 + sVar4," of ( ch",8);
    builtin_strncpy(acStack_40b + sVar4," choose ",8);
    builtin_strncpy(acStack_403 + sVar4,"folder ",8);
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar4 = strlen(local_428);
      builtin_strncpy(local_428 + sVar4,"with pro",8);
      *(undefined8 *)(&uStack_422 + sVar4) = 0x222074706d6f72;
      strcat(local_428,aTitle);
      sVar4 = strlen(local_428);
      (local_428 + sVar4)[0] = '\"';
      (local_428 + sVar4)[1] = ' ';
      local_428[sVar4 + 2] = '\0';
    }
    if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
      sVar4 = strlen(local_428);
      builtin_strncpy(local_428 + sVar4,"default ",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"location",8);
      *(undefined4 *)((long)&uStack_419 + sVar4) = 0x22206e;
      strcat(local_428,aDefaultPath);
      sVar4 = strlen(local_428);
      (local_428 + sVar4)[0] = '\"';
      (local_428 + sVar4)[1] = ' ';
      local_428[sVar4 + 2] = '\0';
    }
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4,")\' ",4);
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4,"-e \'on e",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"rror num",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 4),"r number",8);
    builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 4)," -128\' ",8);
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4,"-e \'end ",8);
    *(undefined8 *)(auStack_424 + sVar4 + 1) = 0x2779727420646e;
    iVar2 = osx9orBetter();
    if (iVar2 == 0) {
      sVar4 = strlen(local_428);
      builtin_strncpy(local_428 + sVar4," -e \'end",8);
      *(undefined8 *)((long)&uStack_421 + sVar4) = 0x276c6c65742064;
    }
    goto LAB_00118bbc;
  }
  iVar2 = kdialogPresent();
  if (iVar2 != 0) {
    if ((aTitle == (char *)0x0) || (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 != 0)) {
      builtin_strncpy(local_428,"kdia",4);
      auStack_424 = (undefined1  [2])0x6f6c;
      uStack_422 = 0x67;
      uStack_421._0_1_ = 0;
      iVar2 = kdialogPresent();
      if (iVar2 == 2) {
        sVar4 = strlen(local_428);
        memcpy(local_428 + sVar4,
               " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
      }
      sVar4 = strlen(local_428);
      builtin_strncpy(local_428 + sVar4," --getex",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"istingdi",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 2),"stingdir",8);
      builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 2),"ectory ",8);
      if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
        sVar4 = strlen(local_428);
        builtin_strncpy(local_428 + sVar4,"$PWD",4);
        *(undefined2 *)(auStack_424 + sVar4) = 0x2f;
      }
      else {
        if (*aDefaultPath != '/') {
          sVar4 = strlen(local_428);
          builtin_strncpy(local_428 + sVar4,"$PWD",4);
          *(undefined2 *)(auStack_424 + sVar4) = 0x2f;
        }
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\"';
        (local_428 + sVar4)[1] = '\0';
        strcat(local_428,aDefaultPath);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\"';
        (local_428 + sVar4)[1] = '\0';
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar4 = strlen(local_428);
        builtin_strncpy(local_428 + sVar4," --title",8);
        *(undefined4 *)((long)&uStack_421 + sVar4) = 0x222065;
        strcat(local_428,aTitle);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\"';
        (local_428 + sVar4)[1] = '\0';
      }
      goto LAB_00118bbc;
    }
    uVar5 = 0x676f6c6169646b;
    goto LAB_001189c5;
  }
  iVar2 = zenityPresent();
  if ((iVar2 == 0) && (iVar2 = matedialogPresent(), iVar2 == 0)) {
    if (shellementaryPresent_lShellementaryPresent == '\0') {
      shellementaryPresent_lShellementaryPresent = '\x01';
    }
    if (((shellementaryPresent_lShellementaryPresent != '\0') || (iVar2 = graphicMode(), iVar2 == 0)
        ) && (iVar2 = qarmaPresent(), iVar2 == 0)) {
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (iVar2 = tkinter2Present(), iVar2 != 0)) {
        if ((aTitle == (char *)0x0) || (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 != 0)) {
          strcpy(local_428,gPython2Name);
          iVar2 = isTerminalRunning();
          if ((iVar2 == 0) && (iVar2 = isDarwin(), iVar2 != 0)) {
            sVar4 = strlen(local_428);
            builtin_strncpy(local_428 + sVar4," -i",4);
          }
          sVar4 = strlen(local_428);
          memcpy(local_428 + sVar4,
                 " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();",0x47);
          iVar2 = isDarwin();
          if (iVar2 != 0) {
            sVar4 = strlen(local_428);
            memcpy(local_428 + sVar4,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                   ,0x78);
          }
          sVar4 = strlen(local_428);
          builtin_strncpy(local_428 + sVar4,"print tk",8);
          builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"FileDial",8);
          builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"og.askdi",8);
          builtin_strncpy(acStack_410 + sVar4,"rectory(",8);
          acStack_40b[sVar4 + 3] = '\0';
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar4 = strlen(local_428);
            builtin_strncpy(local_428 + sVar4,"title=\'",8);
            strcat(local_428,aTitle);
            sVar4 = strlen(local_428);
            (local_428 + sVar4)[0] = '\'';
            (local_428 + sVar4)[1] = ',';
            local_428[sVar4 + 2] = '\0';
          }
          if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
            sVar4 = strlen(local_428);
            builtin_strncpy(local_428 + sVar4,"initiald",8);
            *(undefined8 *)(auStack_424 + sVar4 + 1) = 0x273d7269646c61;
            strcat(local_428,aDefaultPath);
            sVar4 = strlen(local_428);
            (local_428 + sVar4)[0] = '\'';
            (local_428 + sVar4)[1] = '\0';
          }
          sVar4 = strlen(local_428);
          (local_428 + sVar4)[0] = ')';
          (local_428 + sVar4)[1] = '\"';
          local_428[sVar4 + 2] = '\0';
          goto LAB_00118bbc;
        }
        uVar7._0_1_ = 'o';
        uVar7._1_1_ = 'n';
        uVar7._2_1_ = '2';
        uVar7._3_1_ = '-';
LAB_00119321:
        tinyfd_response._4_2_ = (undefined2)uVar7;
        tinyfd_response[6] = SUB41(uVar7,2);
        builtin_strncpy(tinyfd_response + 8,"tkinter",8);
        tinyfd_response[7] = SUB41(uVar7,3);
        builtin_strncpy(tinyfd_response,"pyth",4);
        return (char *)0x1;
      }
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (iVar2 = tkinter3Present(), iVar2 != 0)) {
        if (aTitle == (char *)0x0) {
          strcpy(local_428,gPython3Name);
          sVar4 = strlen(local_428);
          memcpy(local_428 + sVar4,
                 " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                 ,0x59);
          sVar4 = strlen(local_428);
          builtin_strncpy(local_428 + sVar4,"print( f",8);
          builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"iledialo",8);
          builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"g.askdir",8);
          builtin_strncpy(acStack_410 + sVar4,"ectory(",8);
        }
        else {
          iVar2 = strcmp(aTitle,"tinyfd_query");
          if (iVar2 == 0) {
            uVar7._0_1_ = 'o';
            uVar7._1_1_ = 'n';
            uVar7._2_1_ = '3';
            uVar7._3_1_ = '-';
            goto LAB_00119321;
          }
          strcpy(local_428,gPython3Name);
          sVar4 = strlen(local_428);
          memcpy(local_428 + sVar4,
                 " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                 ,0x59);
          sVar4 = strlen(local_428);
          builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"g.askdir",8);
          builtin_strncpy(acStack_410 + sVar4,"ectory(",8);
          builtin_strncpy(local_428 + sVar4,"print( f",8);
          builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"iledialo",8);
          if (*aTitle != '\0') {
            sVar4 = strlen(local_428);
            builtin_strncpy(local_428 + sVar4,"title=\'",8);
            strcat(local_428,aTitle);
            sVar4 = strlen(local_428);
            (local_428 + sVar4)[0] = '\'';
            (local_428 + sVar4)[1] = ',';
            local_428[sVar4 + 2] = '\0';
          }
        }
        if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
          sVar4 = strlen(local_428);
          builtin_strncpy(local_428 + sVar4,"initiald",8);
          *(undefined8 *)(auStack_424 + sVar4 + 1) = 0x273d7269646c61;
          strcat(local_428,aDefaultPath);
          sVar4 = strlen(local_428);
          (local_428 + sVar4)[0] = '\'';
          (local_428 + sVar4)[1] = '\0';
        }
        sVar4 = strlen(local_428);
        builtin_strncpy(local_428 + sVar4,") )\"",4);
        auStack_424[sVar4] = 0;
        goto LAB_00118bbc;
      }
      iVar2 = xdialogPresent();
      if ((iVar2 == 0) && (pcVar6 = dialogName(), pcVar6 == (char *)0x0)) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          pcVar6 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
          return pcVar6;
        }
        pcVar6 = tinyfd_inputBox(aTitle,"Select folder","");
        if (pcVar6 == (char *)0x0) {
          return (char *)0x0;
        }
        if (*pcVar6 != '\0') {
          iVar2 = dirExists(pcVar6);
          if (iVar2 != 0) {
            return pcVar6;
          }
          return (char *)0x0;
        }
        return (char *)0x0;
      }
      iVar2 = xdialogPresent();
      if (iVar2 == 0) {
        iVar3 = isTerminalRunning();
        if (iVar3 != 0) {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            builtin_strncpy(tinyfd_response,"dialog",7);
            return (char *)0x0;
          }
          builtin_strncpy(local_428,"(dia",4);
          auStack_424 = (undefined1  [2])0x6f6c;
          uStack_422 = 0x67;
          uStack_421._0_1_ = 0x20;
          uStack_421._1_1_ = 0;
          goto LAB_00118f82;
        }
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"dialog",7);
          return (char *)0x0;
        }
        pcVar6 = terminalName();
        strcpy(local_428,pcVar6);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\'';
        (local_428 + sVar4)[1] = '(';
        local_428[sVar4 + 2] = '\0';
        pcVar6 = dialogName();
        strcat(local_428,pcVar6);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = ' ';
        (local_428 + sVar4)[1] = '\0';
        bVar1 = false;
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          uVar5 = 0x676f6c61696478;
          goto LAB_001189c5;
        }
        builtin_strncpy(local_428,"(Xdi",4);
        auStack_424 = (undefined1  [2])0x6c61;
        uStack_422 = 0x6f;
        uStack_421._0_1_ = 0x67;
        uStack_421._1_1_ = 0x20;
        uStack_421._2_1_ = 0;
LAB_00118f82:
        bVar1 = true;
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar4 = strlen(local_428);
        builtin_strncpy(local_428 + sVar4,"--title ",8);
        *(undefined2 *)((long)&uStack_421 + sVar4 + 1) = 0x22;
        strcat(local_428,aTitle);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\"';
        (local_428 + sVar4)[1] = ' ';
        local_428[sVar4 + 2] = '\0';
      }
      iVar3 = xdialogPresent();
      if ((iVar3 == 0) && (iVar3 = gdialogPresent(), iVar3 == 0)) {
        sVar4 = strlen(local_428);
        builtin_strncpy(local_428 + sVar4,"--backti",8);
        *(undefined8 *)(&uStack_422 + sVar4) = 0x2220656c746974;
        sVar4 = strlen(local_428);
        memcpy(local_428 + sVar4,
               "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY",0x4b);
        sVar4 = strlen(local_428);
        (local_428 + sVar4)[0] = '\"';
        (local_428 + sVar4)[1] = ' ';
        local_428[sVar4 + 2] = '\0';
      }
      sVar4 = strlen(local_428);
      builtin_strncpy(local_428 + sVar4,"--dselec",8);
      *(undefined4 *)((long)&uStack_421 + sVar4 + 1) = 0x222074;
      if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
        iVar3 = isTerminalRunning();
        if (iVar3 == 0 && iVar2 == 0) {
          pcVar6 = getenv("HOME");
          strcat(local_428,pcVar6);
          sVar4 = strlen(local_428);
          (local_428 + sVar4)[0] = '/';
          (local_428 + sVar4)[1] = '\0';
        }
        else {
          sVar4 = strlen(local_428);
          (local_428 + sVar4)[0] = '.';
          (local_428 + sVar4)[1] = '/';
          local_428[sVar4 + 2] = '\0';
        }
      }
      else {
        strcat(local_428,aDefaultPath);
        ensureFinalSlash(local_428);
      }
      sVar4 = strlen(local_428);
      if (iVar2 == 0) {
        builtin_strncpy(local_428 + sVar4,"\" 0 60  ",8);
        builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),">/dev/tt",8);
        *(undefined4 *)((long)&uStack_419 + sVar4 + 1) = 0x202979;
        sVar4 = strlen(local_428);
        if (bVar1) {
          builtin_strncpy(local_428 + sVar4,"2>&1 ; c",8);
          builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"lear >/d",8);
          *(undefined8 *)((long)&uStack_419 + sVar4) = 0x7974742f766564;
        }
        else {
          builtin_strncpy(acStack_403 + sVar4 + 3,"m /tmp/tin",10);
          builtin_strncpy(acStack_3f6 + sVar4,"yfd.txt",8);
          builtin_strncpy(acStack_40b + sVar4 + 3,"fd.txt;r",8);
          builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 1),"t\';cat /",8);
          builtin_strncpy(acStack_410 + sVar4,"tmp/tiny",8);
          builtin_strncpy(local_428 + sVar4,"2>/tmp/t",8);
          builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"inyfd.tx",8);
        }
      }
      else {
        *(undefined8 *)((long)&uStack_421 + sVar4) = 0x2031263e322029;
        builtin_strncpy(local_428 + sVar4,"\" 0 60 )",8);
      }
      goto LAB_00118bbc;
    }
  }
  iVar2 = zenityPresent();
  if (iVar2 == 0) {
    iVar2 = matedialogPresent();
    if (iVar2 == 0) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      if ((shellementaryPresent_lShellementaryPresent == '\0') &&
         (iVar2 = graphicMode(), iVar2 != 0)) {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response + 7,"entary",7);
          uVar5 = 0x656d656c6c656873;
LAB_001189c5:
          tinyfd_response._0_4_ = (undefined4)uVar5;
          tinyfd_response._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
          tinyfd_response[6] = (char)((ulong)uVar5 >> 0x30);
          tinyfd_response[7] = (char)((ulong)uVar5 >> 0x38);
          return (char *)0x1;
        }
        uStack_421._1_1_ = 0x6e;
        uStack_421._2_1_ = 0x74;
        uStack_421._3_4_ = 0x797261;
        builtin_strncpy(local_428,"shel",4);
        auStack_424 = (undefined1  [2])0x656c;
        uStack_422 = 0x6d;
        uStack_421._0_1_ = 0x65;
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
          builtin_strncpy(tinyfd_response,"qarma",6);
          return (char *)0x1;
        }
        auStack_424 = (undefined1  [2])0x61;
        builtin_strncpy(local_428,"qarm",4);
        pcVar6 = getenv("SSH_TTY");
        if (pcVar6 == (char *)0x0) {
          sVar4 = strlen(local_428);
          pcVar6 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          __n = 0x41;
          goto LAB_00118ada;
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
        builtin_strncpy(tinyfd_response,"matedialog",0xb);
        return (char *)0x1;
      }
      builtin_strncpy(local_428,"mate",4);
      auStack_424 = (undefined1  [2])0x6964;
      uStack_422 = 0x61;
      uStack_421._0_1_ = 0x6c;
      uStack_421._1_1_ = 0x6f;
      uStack_421._2_1_ = 0x67;
      uStack_421._3_4_ = uStack_421._3_4_ & 0xffffff00;
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar2 = strcmp(aTitle,"tinyfd_query"), iVar2 == 0)) {
      builtin_strncpy(tinyfd_response,"zenity",7);
      return (char *)0x1;
    }
    auStack_424 = (undefined1  [2])0x7974;
    uStack_422 = 0;
    builtin_strncpy(local_428,"zeni",4);
    iVar2 = zenity3Present();
    if ((3 < iVar2) && (pcVar6 = getenv("SSH_TTY"), pcVar6 == (char *)0x0)) {
      sVar4 = strlen(local_428);
      pcVar6 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
      __n = 0x4b;
LAB_00118ada:
      memcpy(local_428 + sVar4,pcVar6,__n);
    }
  }
  sVar4 = strlen(local_428);
  builtin_strncpy(local_428 + sVar4," --file-",8);
  builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 1),"selectio",8);
  builtin_strncpy((char *)((long)&uStack_421 + sVar4 + 7),"ion --di",8);
  builtin_strncpy((char *)((long)&uStack_419 + sVar4 + 7),"rectory",8);
  if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4," --title",8);
    *(undefined4 *)((long)&uStack_421 + sVar4) = 0x223d65;
    strcat(local_428,aTitle);
    sVar4 = strlen(local_428);
    (local_428 + sVar4)[0] = '\"';
    (local_428 + sVar4)[1] = '\0';
  }
  if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4," --filen",8);
    *(undefined8 *)(&uStack_422 + sVar4) = 0x223d656d616e65;
    strcat(local_428,aDefaultPath);
    sVar4 = strlen(local_428);
    (local_428 + sVar4)[0] = '\"';
    (local_428 + sVar4)[1] = '\0';
  }
  if (tinyfd_silent != 0) {
    sVar4 = strlen(local_428);
    builtin_strncpy(local_428 + sVar4," 2>/dev/",8);
    *(undefined8 *)(&uStack_422 + sVar4) = 0x206c6c756e2f76;
  }
LAB_00118bbc:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",local_428);
  }
  __stream = popen(local_428,"r");
  if (__stream != (FILE *)0x0) {
    do {
      pcVar6 = fgets(tinyfd_selectFolderDialog::lBuff,0x400,__stream);
    } while (pcVar6 != (char *)0x0);
    pclose(__stream);
    sVar4 = strlen(tinyfd_selectFolderDialog::lBuff);
    if (tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] == '\n') {
      tinyfd_openFileDialog::lBuff[sVar4 + 0x7fff] = '\0';
    }
    if (tinyfd_selectFolderDialog::lBuff[0] != '\0') {
      iVar2 = dirExists(tinyfd_selectFolderDialog::lBuff);
      if (iVar2 == 0) {
        return (char *)0x0;
      }
      return tinyfd_selectFolderDialog::lBuff;
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_selectFolderDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPath ) /* NULL or "" */
{
    static char lBuff [MAX_PATH_OR_CMD] ;
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
#ifndef TINYFD_NOSELECTFOLDERWIN
                        p = selectFolderDialogWinGui8(lBuff, aTitle, aDefaultPath);
                }
                else
                {
                        p = selectFolderDialogWinGuiA(lBuff, aTitle, aDefaultPath);
#endif /*TINYFD_NOSELECTFOLDERWIN*/
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = selectFolderDialogWinConsole(lBuff,aTitle,aDefaultPath);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Select folder","");
        }
        
        if ( ! p || ! strlen( p ) || ! dirExists( p ) )
        {
                return NULL ;
        }
        return p ;
}